

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O1

void __thiscall
Style::Style::parseMaps
          (Style *this,xml_node<char> *def,
          vector<Style::SourceMap,_std::allocator<Style::SourceMap>_> *maps)

{
  char *pcVar1;
  int iVar2;
  logic_error *this_00;
  char *__s1;
  xml_node<char> *node;
  
  pcVar1 = (def->super_xml_base<char>).m_name;
  __s1 = &rapidxml::xml_base<char>::nullstr()::zero;
  if (pcVar1 != (char *)0x0) {
    __s1 = pcVar1;
  }
  iVar2 = strcmp(__s1,"bcf:maps");
  if (iVar2 == 0) {
    node = def->m_first_node;
    while( true ) {
      if (node == (xml_node<char> *)0x0) {
        return;
      }
      parseMap(node,maps);
      if ((node->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) break;
      node = node->m_next_sibling;
    }
    __assert_fail("this->m_parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/rapidxml-1.13/rapidxml.hpp"
                  ,0x3ee,
                  "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                 );
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Unexpected node name");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Style::parseMaps (xml_node<> *def, vector<SourceMap> &maps) {
    EXPECT_NAME(def, "bcf:maps");

    for (xml_node<> *node = def->first_node(); node; node = node->next_sibling()) {
        parseMap(node, maps);
    }
}